

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O0

void game_Run(void)

{
  _Bool _Var1;
  char c;
  ECommand_t cmd_00;
  ECommand_t cmd;
  
  dd_Init();
  InitNewGame();
  while (((ToExit ^ 0xffU) & 1) != 0) {
    _Var1 = CheckVictory();
    if (!_Var1) {
      dspl_Render(ActiveCmd);
      dspl_SetMessage("");
      c = input_ReadKey();
      cmd_00 = ctrl_KeyToCmd(c);
      _Var1 = ControlGame(cmd_00);
      if (((!_Var1) && (_Var1 = ControlDisplay(cmd_00), !_Var1)) &&
         (_Var1 = ControlTable(cmd_00), !_Var1)) {
        if ((FirstFail & 1U) == 0) {
          dspl_SetMessage("!! Invalid key");
        }
        else {
          dspl_SetMessage("!! Invalid key - press H for help");
          FirstFail = false;
        }
      }
    }
  }
  dd_Save();
  dspl_Clear();
  return;
}

Assistant:

void game_Run(void)
{
  dd_Init();
  InitNewGame();

  while (!ToExit) {
    ECommand_t cmd;
    if (CheckVictory()) {
      // restart or exit game
      continue;
    }
    dspl_Render(ActiveCmd);
    dspl_SetMessage("");

    cmd = ctrl_KeyToCmd(input_ReadKey());

    if (ControlGame(cmd) || ControlDisplay(cmd) || ControlTable(cmd)) {
      continue;
    } else {
      if (FirstFail) {
        dspl_SetMessage("!! Invalid key - press H for help");
        FirstFail = false;
      } else {
        dspl_SetMessage("!! Invalid key");
      }
    }
  }

  dd_Save();
  dspl_Clear();
}